

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void scrollbar_timer_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object inter_command;
  Am_Object inter;
  Am_Object scrollbar;
  Am_Object scroll_command;
  Am_Timer_Method method;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Inter_Location local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Time local_50;
  Am_Object local_48;
  Am_Value local_40;
  Am_Timer_Method local_30;
  
  pAVar2 = Am_Object::Get(interp,0x1ba,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(interp,0xe9,0);
    Am_Time::Am_Time((Am_Time *)&local_30,pAVar2);
    Am_Time::Am_Time(&local_50,(Am_Time *)&local_30);
    Am_Object::Am_Object(&local_58,interp);
    Am_Register_Timer(&local_50,&local_58,0xe8,false);
    Am_Object::~Am_Object(&local_58);
    Am_Time::~Am_Time(&local_50);
    Am_Object::Set(interp,0x1ba,false,0);
    Am_Time::~Am_Time((Am_Time *)&local_30);
  }
  pAVar2 = Am_Object::Get(&Am_Stepping_Animator,0xe8,0);
  Am_Timer_Method::Am_Timer_Method(&local_30,pAVar2);
  Am_Object::Am_Object(&local_48,interp);
  (*local_30.Call)((Am_Object_Data *)&local_48,elapsed_time);
  Am_Object::~Am_Object(&local_48);
  pAVar2 = Am_Object::Get(interp,0x193,0);
  Am_Object::Am_Object(&local_a0,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x1ac,0);
  Am_Object::Am_Object(&local_a8,pAVar2);
  pAVar2 = Am_Object::Get(&local_a8,0xc5,0);
  Am_Object::Am_Object(&local_b0,pAVar2);
  pAVar2 = Am_Object::Get(&local_a0,0xc5,0);
  Am_Object::Am_Object(&local_60,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value(&local_40,pAVar2);
  Am_Object::Am_Object(&local_68,&local_a0);
  Am_Object::Am_Object(&local_70,&local_60);
  Am_Object::Am_Object(&local_78,&local_b0);
  set_scrollbar_and_commands(&local_40,&local_68,&local_70,&local_78,false);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Value::~Am_Value(&local_40);
  Am_Object::Am_Object(&local_80,&local_a8);
  Am_Object::Am_Object(&local_88,&local_b0);
  Am_Object::Am_Object(&local_90,&Am_No_Object);
  Am_Inter_Location::Am_Inter_Location(&local_98,&Am_No_Location);
  Am_Register_For_Undo(&local_80,&local_88,&local_90,&local_98,(Am_Impl_Command_Setter *)0x0);
  Am_Inter_Location::~Am_Inter_Location(&local_98);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_a0);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, scrollbar_timer,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  bool first_tick = interp.Get(Am_FIRST_TICK);

  if (first_tick) {
    // set a continuous timer for every REPEAT_DELAY
    Am_Time delay = interp.Get(Am_REPEAT_DELAY);
    Am_Register_Timer(delay, interp, Am_ANIMATION_METHOD, false);
    interp.Set(Am_FIRST_TICK, false);
  }

  // call the stepper now
  Am_Timer_Method method = Am_Stepping_Animator.Get(Am_ANIMATION_METHOD);
  method.Call(interp, elapsed_time);

  // propagate values to the scrollbar's various parts
  Am_Object scrollbar = interp.Get(Am_OPERATES_ON);
  Am_Object inter = interp.Get(Am_INTERACTOR);
  Am_Object inter_command = inter.Get(Am_COMMAND);
  Am_Object scroll_command = scrollbar.Get(Am_COMMAND);
  set_scrollbar_and_commands(interp.Get(Am_VALUE), scrollbar, scroll_command,
                             inter_command, false);
  //pretend this is a final function, so call all parent methods
  Am_Register_For_Undo(inter, inter_command, Am_No_Object, Am_No_Location,
                       (nullptr));
}